

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O2

ZyanStatus ZyanVectorDeleteRange(ZyanVector *vector,ZyanUSize index,ZyanUSize count)

{
  ulong uVar1;
  void *pvVar2;
  ZyanStatus ZVar3;
  ZyanUSize ZVar4;
  long lVar6;
  ZyanUSize i;
  ulong uVar7;
  ulong uVar5;
  
  ZVar3 = 0x80100004;
  if (count != 0 && vector != (ZyanVector *)0x0) {
    uVar1 = count + index;
    uVar5 = vector->size;
    ZVar3 = 0x80100008;
    if (uVar1 <= uVar5) {
      uVar7 = index;
      if (vector->destructor != (ZyanMemberProcedure)0x0) {
        for (; uVar7 < uVar1; uVar7 = uVar7 + 1) {
          (*vector->destructor)((void *)(vector->element_size * uVar7 + (long)vector->data));
        }
        uVar5 = vector->size;
      }
      if (uVar1 <= uVar5 && uVar5 - uVar1 != 0) {
        ZVar4 = vector->element_size;
        if (ZVar4 == 0) {
          __assert_fail("vector->element_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                        ,0x85,"ZyanStatus ZyanVectorShiftLeft(ZyanVector *, ZyanUSize, ZyanUSize)");
        }
        pvVar2 = vector->data;
        if (pvVar2 == (void *)0x0) {
          __assert_fail("vector->data",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                        ,0x86,"ZyanStatus ZyanVectorShiftLeft(ZyanVector *, ZyanUSize, ZyanUSize)");
        }
        memmove((void *)(index * ZVar4 + (long)pvVar2),(void *)(uVar1 * ZVar4 + (long)pvVar2),
                (uVar5 - uVar1) * ZVar4);
        uVar5 = vector->size;
      }
      ZVar4 = uVar5 - count;
      vector->size = ZVar4;
      ZVar3 = 0x100000;
      if (((ulong)vector->shrink_threshold != 0) &&
         (vector->shrink_threshold * ZVar4 < vector->capacity)) {
        lVar6 = ZVar4 * vector->growth_factor;
        ZVar3 = ZyanVectorReallocate(vector,lVar6 + (ulong)(lVar6 == 0));
        return ZVar3;
      }
    }
  }
  return ZVar3;
}

Assistant:

ZyanStatus ZyanVectorDeleteRange(ZyanVector* vector, ZyanUSize index, ZyanUSize count)
{
    if (!vector || !count)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
    if (index + count > vector->size)
    {
        return ZYAN_STATUS_OUT_OF_RANGE;
    }

    if (vector->destructor)
    {
        for (ZyanUSize i = index; i < index + count; ++i)
        {
            vector->destructor(ZYCORE_VECTOR_OFFSET(vector, i));
        }
    }

    if (index + count < vector->size)
    {
        ZYAN_CHECK(ZyanVectorShiftLeft(vector, index, count));
    }

    vector->size -= count;
    if (ZYCORE_VECTOR_SHOULD_SHRINK(vector->size, vector->capacity, vector->shrink_threshold))
    {
        return ZyanVectorReallocate(vector,
            ZYAN_MAX(1, (ZyanUSize)(vector->size * vector->growth_factor)));
    }

    return ZYAN_STATUS_SUCCESS;
}